

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::NetStateRule::NetStateRule(NetStateRule *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__NetStateRule_006f88a0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = 0;
  (this->stage_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->stage_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->stage_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->stage_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->not_stage_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->not_stage_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->not_stage_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->not_stage_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  if (this != (NetStateRule *)&_NetStateRule_default_instance_) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  this->_cached_size_ = 0;
  this->max_level_ = 0;
  this->phase_ = 0;
  this->min_level_ = 0;
  return;
}

Assistant:

NetStateRule::NetStateRule()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:caffe.NetStateRule)
}